

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall slang::parsing::Lexer::scanWhitespace(Lexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  TriviaKind local_11;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  pbVar2 = (byte *)this->sourceBuffer;
  pbVar1 = pbVar2;
  while( true ) {
    if ((0x20 < (ulong)*pbVar1) || ((0x100001a00U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0)) break;
    this->sourceBuffer = (char *)(pbVar1 + 1);
    pbVar2 = pbVar2 + 1;
    pbVar1 = pbVar1 + 1;
  }
  local_11 = Whitespace;
  local_10._M_str = this->marker;
  local_10._M_len = (size_t)(uint)((int)pbVar2 - (int)local_10._M_str);
  SmallVectorBase<slang::parsing::Trivia>::
  emplace_back<slang::parsing::TriviaKind&,std::basic_string_view<char,std::char_traits<char>>>
            (&(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>,&local_11,&local_10
            );
  return;
}

Assistant:

void Lexer::scanWhitespace() {
    bool done = false;
    while (!done) {
        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                break;
            default:
                done = true;
                break;
        }
    }
    addTrivia(TriviaKind::Whitespace);
}